

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

const_iterator * __thiscall
QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
          (const_iterator *__return_storage_ptr__,QMultiHash<QString,_QCss::StyleRule> *this,
          QString *key)

{
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *this_00;
  Data *pDVar1;
  Span *pSVar2;
  size_t hash;
  ulong uVar3;
  QStringView QVar4;
  Bucket BVar5;
  
  if (this->m_size != 0) {
    this_00 = this->d;
    QVar4.m_data = (key->d).ptr;
    QVar4.m_size = (key->d).size;
    hash = qHash(QVar4,this_00->seed);
    BVar5 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::
            findBucketWithHash<QString>(this_00,key,hash);
    if ((BVar5.span)->offsets[BVar5.index] != 0xff) {
      pDVar1 = this->d;
      pSVar2 = pDVar1->spans;
      uVar3 = ((ulong)((long)BVar5.span - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | BVar5.index;
      (__return_storage_ptr__->i).d = pDVar1;
      (__return_storage_ptr__->i).bucket = uVar3;
      __return_storage_ptr__->e = (Chain **)0x0;
      if (pDVar1 == (Data *)0x0) {
        return __return_storage_ptr__;
      }
      uVar3 = uVar3 >> 7;
      __return_storage_ptr__->e =
           (Chain **)
           (pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)BVar5.index & 0x7f]].storage.data +
           0x18);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->i).d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)0x0;
  (__return_storage_ptr__->i).bucket = 0;
  __return_storage_ptr__->e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }